

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>::
~QueryPoolGraphicStatisticsTest
          (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderTestInstance>
           *this)

{
  pointer pVVar1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolGraphicStatisticsTest_00d60160;
  pVVar1 = (this->m_data).
           super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_data).
                                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

QueryPoolGraphicStatisticsTest (tcu::TestContext &context, const char *name, const char *description, const GraphicBasicTestInstance::ParametersGraphic parametersGraphic)
		: TestCase				(context, name, description)
		, m_parametersGraphic	(parametersGraphic)
	{
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
	}